

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::async_reconnect(rpc_client *this)

{
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  reset_socket(this);
  async_connect(this);
  local_10.__r = this->connect_timeout_;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_10);
  return;
}

Assistant:

void async_reconnect() {
    reset_socket();
    async_connect();
    std::this_thread::sleep_for(std::chrono::milliseconds(connect_timeout_));
  }